

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

DSA * DSA_new(void)

{
  CRYPTO_EX_DATA *ad;
  void *in_RSI;
  DSA *dsa;
  
  dsa = (DSA *)OPENSSL_zalloc(0x80);
  if (dsa == (DSA *)0x0) {
    dsa = (DSA *)0x0;
  }
  else {
    dsa->references = 1;
    CRYPTO_MUTEX_init(&dsa->method_mont_lock);
    CRYPTO_new_ex_data((int)dsa + 0x78,in_RSI,ad);
  }
  return (DSA *)dsa;
}

Assistant:

DSA *DSA_new(void) {
  DSA *dsa = reinterpret_cast<DSA *>(OPENSSL_zalloc(sizeof(DSA)));
  if (dsa == NULL) {
    return NULL;
  }

  dsa->references = 1;
  CRYPTO_MUTEX_init(&dsa->method_mont_lock);
  CRYPTO_new_ex_data(&dsa->ex_data);
  return dsa;
}